

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Material *material
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  TypedAttributeWithFallback<tinyusdz::Purpose> *pTVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  string *psVar14;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  bool local_301;
  string local_2f8;
  undefined1 local_2d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  string *local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_280;
  TypedConnection<tinyusdz::Token> *local_278;
  TypedConnection<tinyusdz::Token> *local_270;
  TypedConnection<tinyusdz::Token> *local_268;
  _Base_ptr local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_228;
  string local_208;
  string local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258._M_impl.super__Rb_tree_header._M_header;
  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var13 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_260 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_301 = p_Var13 == local_260;
  local_2b0 = warn;
  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
  if (!local_301) {
    local_268 = &material->surface;
    local_270 = &material->displacement;
    local_278 = &material->volume;
    local_280 = &(material->super_UsdShadePrim).props;
    local_288 = &(material->super_UsdShadePrim).purpose;
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,*(long *)(p_Var13 + 1),
                 (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
      prop = (Property *)(p_Var13 + 2);
      local_1a8._0_8_ = &local_198;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"outputs:surface","");
      psVar14 = (string *)local_1a8;
      anon_unknown_0::ParseShaderInputConnectionProperty
                ((ParseResult *)local_2d8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258,&local_1e8,prop,(string *)local_1a8,local_268);
      if ((code **)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      iVar7 = 0;
      if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
        iVar7 = 3;
LAB_0025e7db:
        bVar6 = false;
      }
      else {
        bVar6 = true;
        if (local_2d8._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1314);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_2a8[0] = local_298;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    (&local_2f8,(fmt *)local_2a8,(string *)"outputs:surface",
                     (char (*) [16])(local_2d8 + 8),psVar14);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                              local_2f8._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          paVar3 = &local_2f8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != paVar3) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0],local_298[0] + 1);
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_2f8.field_2._M_allocated_capacity = *psVar1;
              local_2f8.field_2._8_8_ = plVar10[3];
              local_2f8._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_2f8.field_2._M_allocated_capacity = *psVar1;
              local_2f8._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_2f8._M_string_length = plVar10[1];
            *plVar10 = (long)psVar1;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != paVar3) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          iVar7 = 1;
          goto LAB_0025e7db;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._8_8_ != &aStack_2c0) {
        operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
      }
      if (bVar6) {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,*(long *)(p_Var13 + 1),
                   (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"outputs:displacement","");
        psVar14 = (string *)local_1a8;
        anon_unknown_0::ParseShaderInputConnectionProperty
                  ((ParseResult *)local_2d8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258,&local_208,prop,(string *)local_1a8,local_270);
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 0;
        if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_0025eadc:
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (local_2d8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1316);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            local_2a8[0] = local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
            fmt::format<char[21],std::__cxx11::string>
                      (&local_2f8,(fmt *)local_2a8,(string *)"outputs:displacement",
                       (char (*) [21])(local_2d8 + 8),psVar14);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                                local_2f8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            paVar3 = &local_2f8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != paVar3) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0],local_298[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8.field_2._8_8_ = plVar10[3];
                local_2f8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_2f8._M_string_length = plVar10[1];
              *plVar10 = (long)psVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar7 = 1;
            goto LAB_0025eadc;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._8_8_ != &aStack_2c0) {
          operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
        }
        if (bVar6) {
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,*(long *)(p_Var13 + 1),
                     (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"outputs:volume","")
          ;
          psVar14 = (string *)local_1a8;
          anon_unknown_0::ParseShaderInputConnectionProperty
                    ((ParseResult *)local_2d8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_258,&local_228,prop,(string *)local_1a8,local_278);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          iVar7 = 0;
          if ((local_2d8._0_8_ & 0xfffffffd) == 0) {
            iVar7 = 3;
LAB_0025eddd:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_2d8._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x1318);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              local_2a8[0] = local_298;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2a8,"Parsing shader property `{}` failed. Error: {}","");
              fmt::format<char[15],std::__cxx11::string>
                        (&local_2f8,(fmt *)local_2a8,(string *)"outputs:volume",
                         (char (*) [15])(local_2d8 + 8),psVar14);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                                  local_2f8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              paVar3 = &local_2f8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar10 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_2a8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_2f8.field_2._M_allocated_capacity = *psVar1;
                  local_2f8.field_2._8_8_ = plVar10[3];
                  local_2f8._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_2f8.field_2._M_allocated_capacity = *psVar1;
                  local_2f8._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_2f8._M_string_length = plVar10[1];
                *plVar10 = (long)psVar1;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  local_2f8.field_2._M_allocated_capacity + 1);
                }
                if (local_2a8[0] != local_298) {
                  operator_delete(local_2a8[0],local_298[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              iVar7 = 1;
              goto LAB_0025eddd;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._8_8_ != &aStack_2c0) {
            operator_delete((void *)local_2d8._8_8_,aStack_2c0._M_allocated_capacity + 1);
          }
          if (bVar6) {
            __k = p_Var13 + 1;
            iVar7 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar7 == 0) {
              local_1a8._0_8_ = &local_198;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"purpose","");
              cVar11 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_258,(string *)local_1a8);
              if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
              iVar7 = 3;
              if ((_Rb_tree_header *)cVar11._M_node == &local_258._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var13[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_1a8._0_8_ = &local_198;
                  local_1a8._8_8_ = 0;
                  local_198 = (code *)((ulong)local_198 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)prop);
                }
                local_2d8._0_8_ = local_2d8 + 0x10;
                local_2d8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_2d8._16_6_ = 0x6e656b6f74;
                if (((local_1a8._8_8_ == 5) &&
                    (iVar8 = bcmp((void *)local_1a8._0_8_,local_2d8 + 0x10,5), iVar8 == 0)) &&
                   (uVar4 = *(uint *)((long)&p_Var13[0x17]._M_parent + 4), uVar4 < 2)) {
                  if ((code **)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x131a);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"purpose",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\n",1);
                    pTVar5 = local_288;
                    if (local_2b0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar10 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p
                                                  );
                      psVar1 = (size_type *)(plVar10 + 2);
                      if ((size_type *)*plVar10 == psVar1) {
                        local_2d8._16_8_ = *psVar1;
                        aStack_2c0._M_allocated_capacity = plVar10[3];
                        local_2d8._0_8_ = local_2d8 + 0x10;
                      }
                      else {
                        local_2d8._16_8_ = *psVar1;
                        local_2d8._0_8_ = (size_type *)*plVar10;
                      }
                      local_2d8._8_8_ = plVar10[1];
                      *plVar10 = (long)psVar1;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                        operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                        operator_delete(local_2f8._M_dataplus._M_p,
                                        local_2f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    ::std::ios_base::~ios_base(local_138);
                    AttrMetas::operator=(&pTVar5->_metas,(AttrMetas *)(p_Var13 + 7));
                    local_1a8._0_8_ = &local_198;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,"purpose","");
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_258,(string *)local_1a8);
                    if ((code **)local_1a8._0_8_ != &local_198) {
                      operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                    }
                    goto LAB_0025f589;
                  }
                }
                else if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                local_1a8._8_8_ = 0;
                local_1a8._0_8_ = PurposeEnumHandler;
                pcStack_190 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_198 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_2d8._0_8_ = local_2d8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"purpose","");
                bVar6 = options->strict_allowedToken_check;
                local_1b8 = (code *)0x0;
                pcStack_1b0 = (code *)0x0;
                local_1c8._M_unused._M_object = (void *)0x0;
                local_1c8._8_8_ = 0;
                if (local_198 != (code *)0x0) {
                  (*local_198)(&local_1c8,(string *)local_1a8,2);
                  local_1b8 = local_198;
                  pcStack_1b0 = pcStack_190;
                }
                pTVar5 = local_288;
                bVar6 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  ((string *)local_2d8,bVar6,
                                   (EnumHandlerFun<tinyusdz::Purpose> *)&local_1c8,(Attribute *)prop
                                   ,local_288,local_2b0,err);
                if (local_1b8 != (code *)0x0) {
                  (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
                }
                if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                iVar7 = 1;
                if (bVar6) {
                  AttrMetas::operator=(&pTVar5->_metas,(AttrMetas *)(p_Var13 + 7));
                  local_2d8._0_8_ = local_2d8 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2d8,"purpose","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_258,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2d8);
                  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
                    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                  }
                  iVar7 = 3;
                }
                if (local_198 != (code *)0x0) {
                  (*local_198)((string *)local_1a8,(string *)local_1a8,3);
                }
              }
            }
            else {
              cVar11 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_258,(key_type *)__k);
              if ((_Rb_tree_header *)cVar11._M_node == &local_258._M_impl.super__Rb_tree_header) {
                pmVar12 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_280,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar12);
                (pmVar12->_attrib)._varying_authored = (bool)p_Var13[3].field_0x4;
                (pmVar12->_attrib)._variability = p_Var13[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar12->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar12->_attrib)._var,(any *)&p_Var13[4]._M_parent);
                (pmVar12->_attrib)._var._blocked = SUB41(p_Var13[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(pmVar12->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var13[5]._M_parent);
                (pmVar12->_attrib)._var._ts._dirty = SUB41(p_Var13[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar12->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var13[6]._M_parent);
                AttrMetas::operator=(&(pmVar12->_attrib)._metas,(AttrMetas *)(p_Var13 + 7));
                *(_Base_ptr *)&pmVar12->_listOpQual = p_Var13[0x17]._M_parent;
                (pmVar12->_rel).type = *(Type *)&p_Var13[0x17]._M_left;
                Path::operator=(&(pmVar12->_rel).targetPath,(Path *)&p_Var13[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar12->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var13[0x1e]._M_parent);
                (pmVar12->_rel).listOpQual = p_Var13[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar12->_rel)._metas,(AttrMetas *)&p_Var13[0x1f]._M_parent);
                (pmVar12->_rel)._varying_authored = *(bool *)&p_Var13[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar12->_prop_value_type_name);
                pmVar12->_has_custom = *(bool *)&p_Var13[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_258,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar11 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_258,(key_type *)__k);
              iVar7 = 0;
              if ((_Rb_tree_header *)cVar11._M_node == &local_258._M_impl.super__Rb_tree_header) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0x131c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2d8,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_2d8._0_8_,local_2d8._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                psVar1 = (size_type *)(local_2d8 + 0x10);
                if ((size_type *)local_2d8._0_8_ != psVar1) {
                  operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                }
                if (local_2b0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar10 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar10 + 2);
                  if ((size_type *)*plVar10 == psVar2) {
                    local_2d8._16_8_ = *psVar2;
                    aStack_2c0._M_allocated_capacity = plVar10[3];
                    local_2d8._0_8_ = psVar1;
                  }
                  else {
                    local_2d8._16_8_ = *psVar2;
                    local_2d8._0_8_ = (size_type *)*plVar10;
                  }
                  local_2d8._8_8_ = plVar10[1];
                  *plVar10 = (long)psVar2;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2b0,(string *)local_2d8);
                  if ((size_type *)local_2d8._0_8_ != psVar1) {
                    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                    operator_delete(local_2f8._M_dataplus._M_p,
                                    local_2f8.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
            }
          }
        }
      }
LAB_0025f589:
      if ((iVar7 != 3) && (iVar7 != 0)) break;
      p_Var13 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13);
      local_301 = p_Var13 == local_260;
    } while (!local_301);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_258,(_Link_type)local_258._M_impl.super__Rb_tree_header._M_header._M_parent);
  return local_301;
}

Assistant:

bool ReconstructPrim<Material>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Material *material,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;

  // TODO: special treatment for properties with 'inputs' and 'outputs' namespace.

  // For `Material`, `outputs` are terminal attribute and treated as input attribute with connection(Should be "token output:surface.connect = </path/to/shader>").
  for (auto &prop : properties) {
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:surface",
                                  Material, material->surface)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:displacement",
                                  Material, material->displacement)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:volume",
                                  Material, material->volume)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, Material,
                       material->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Material, material->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}